

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

void __thiscall Cache::printInfo(Cache *this)

{
  undefined8 in_RAX;
  pointer pBVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  
  puts("----------- Cache Info ------------");
  printf("Cache Size: %d bytes\n",(ulong)(this->policy).cache_size);
  printf("Block Size: %d bytes\n",(ulong)(this->policy).block_size);
  printf("Block Num: %d\n",(ulong)(this->policy).block_num);
  printf("Associativiy: %d\n",(ulong)(this->policy).associativity);
  printf("Hit Latency: %d\n",(ulong)(this->policy).hit_latency);
  pBVar1 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar1) {
    lVar3 = 0;
    uVar6 = 0;
    do {
      pcVar4 = "invalid";
      pcVar5 = "unmodified";
      if ((&pBVar1->valid)[lVar3] != false) {
        pcVar4 = "valid";
      }
      if ((&pBVar1->dirty)[lVar3] != false) {
        pcVar5 = "modified";
      }
      in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),
                        *(undefined4 *)((long)&pBVar1->last_reference + lVar3));
      printf("Block %d:\ttag 0x%x\tid %d\t%s\t%s\tlast ref %d\n",uVar6 & 0xffffffff,
             (ulong)*(uint *)((long)&pBVar1->tag + lVar3),
             (ulong)*(uint *)((long)&pBVar1->id + lVar3),pcVar4,pcVar5,in_RAX);
      pBVar1 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
      lVar3 = lVar3 + 0x30;
      uVar2 = ((long)(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4) *
              -0x5555555555555555;
    } while (uVar6 <= uVar2 && uVar2 - uVar6 != 0);
  }
  return;
}

Assistant:

void Cache::printInfo() {
    printf("----------- Cache Info ------------\n");
    printf("Cache Size: %d bytes\n", this->policy.cache_size);
    printf("Block Size: %d bytes\n", this->policy.block_size);
    printf("Block Num: %d\n", this->policy.block_num);
    printf("Associativiy: %d\n", this->policy.associativity);
    printf("Hit Latency: %d\n", this->policy.hit_latency);
//    printf("Miss Latency: %d\n", this->policy.miss_latency);

    for (int i = 0; i < this->blocks.size(); i++) {
        const Block &b = this->blocks[i];
        printf("Block %d:\ttag 0x%x\tid %d\t%s\t%s\tlast ref %d\n", i, b.tag, b.id,
               b.valid ? "valid" : "invalid",
               b.dirty ? "modified" : "unmodified", b.last_reference);
    }

}